

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.cpp
# Opt level: O0

size_t coda_urlenc(char *dst,char *src,size_t sz_src)

{
  u_char *puVar1;
  uchar *esrc;
  uchar *psrc;
  uchar *pdst;
  size_t sz_src_local;
  char *src_local;
  char *dst_local;
  
  pdst = (uchar *)dst;
  for (psrc = (uchar *)src; psrc < src + sz_src; psrc = psrc + 1) {
    if ((table_urlenc[(int)(uint)*psrc >> 5] & 1 << (*psrc & 0x1f)) == 0) {
      if (*psrc == ' ') {
        *pdst = '+';
      }
      else {
        *pdst = *psrc;
      }
      pdst = pdst + 1;
    }
    else {
      *pdst = '%';
      puVar1 = pdst + 2;
      pdst[1] = table_hexval[(int)(uint)*psrc >> 4];
      pdst = pdst + 3;
      *puVar1 = table_hexval[(int)(*psrc & 0xf)];
    }
  }
  *pdst = '\0';
  return (long)pdst - (long)dst;
}

Assistant:

size_t coda_urlenc(char* dst, const char* src, size_t sz_src)
{
	unsigned char* pdst = (unsigned char *) dst;
	unsigned char* psrc = (unsigned char *) src;
	unsigned char* esrc = (unsigned char *) src + sz_src;

	while (psrc < esrc)
	{
		if (table_urlenc[*psrc >> 5] & (1 << (*psrc & 0x1f)))
		{
			*pdst++ = '%';
			*pdst++ = table_hexval[*psrc >> 4];
			*pdst++ = table_hexval[*psrc & 0xf];
			++psrc;
		}
		else if (*psrc == ' ')
		{
			*pdst++ = '+';
			++psrc;
		}
		else
		{
			*pdst++ = *psrc++;
		}
	}

	*pdst = 0;

	return pdst - (unsigned char *) dst;
}